

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::CPrimitiveRestartElements<glcts::(anonymous_namespace)::test_api::ES3>::Run
          (CPrimitiveRestartElements<glcts::(anonymous_namespace)::test_api::ES3> *this)

{
  CallLogWrapper *this_00;
  uint uVar1;
  GLuint GVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer pcVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  Functions *pFVar7;
  uint primNum;
  uint primNum_00;
  uint uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  float in_XMM2_Da;
  float in_XMM3_Da;
  CColorArray coords1;
  CColorArray coords2;
  CColorArray bufferTest1;
  CColorArray bufferTest2;
  CColorArray bufferRef2;
  CColorArray bufferRef1;
  DIResult result;
  allocator_type local_719;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_718;
  undefined1 local_6f8 [32];
  undefined1 local_6d8 [40];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_6b0;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_698;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_680;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_668;
  int local_64c;
  undefined4 local_648;
  undefined8 local_644;
  undefined4 local_63c;
  undefined1 local_638 [8];
  _func_int **pp_Stack_630;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_628 [23];
  long local_4b8;
  DILogger local_4b0;
  DILogger local_330;
  DILogger local_1b0;
  
  anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::ES3>();
  local_6f8._0_8_ = local_6f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6f8,0x1af8059);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::ES3>();
  GVar2 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,(string *)local_638,(string *)local_6f8,
                     (string *)local_6d8,true);
  this->_program = GVar2;
  if ((undefined1 *)local_6d8._0_8_ != local_6d8 + 0x10) {
    operator_delete((void *)local_6d8._0_8_,local_6d8._16_8_ + 1);
  }
  if ((undefined1 *)local_6f8._0_8_ != local_6f8 + 0x10) {
    operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ + 1);
  }
  if (local_638 != (undefined1  [8])local_628) {
    operator_delete((void *)local_638,local_628[0]._M_allocated_capacity + 1);
  }
  if (this->_program == 0) {
    return -1;
  }
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,this->_program);
  local_6f8._0_8_ = (pointer)0x0;
  local_6f8._8_8_ = (Functions *)0x0;
  local_6f8._16_8_ = 0;
  TriangleStipGen((CPrimitiveRestartElements<glcts::(anonymous_namespace)::test_api::ES3> *)
                  local_6f8,(CColorArray *)0x2,-1.0,-0.5,in_XMM2_Da,in_XMM3_Da,primNum);
  local_6d8._0_8_ = (pointer)0x0;
  local_6d8._8_8_ = (Functions *)0x0;
  local_6d8._16_8_ = 0;
  TriangleStipGen((CPrimitiveRestartElements<glcts::(anonymous_namespace)::test_api::ES3> *)
                  local_6d8,(CColorArray *)&DAT_00000004,0.5,1.0,in_XMM2_Da,in_XMM3_Da,primNum_00);
  glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->_buffer);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8892,
             (ulong)(local_6d8._8_8_ +
                    ((long)(glActiveShaderProgramFunc *)local_6f8._8_8_ -
                    (long)(local_6f8._0_8_ + local_6d8._0_8_))) & 0xfffffffffffffff0,(void *)0x0,
             0x88e0);
  glu::CallLogWrapper::glBufferSubData
            (this_00,0x8892,0,local_6f8._8_8_ - local_6f8._0_8_,(void *)local_6f8._0_8_);
  glu::CallLogWrapper::glBufferSubData
            (this_00,0x8892,local_6f8._8_8_ - local_6f8._0_8_,local_6d8._8_8_ - local_6d8._0_8_,
             (void *)local_6d8._0_8_);
  glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  lVar9 = (long)(local_6f8._8_8_ - local_6f8._0_8_) >> 4;
  lVar10 = (long)(local_6d8._8_8_ - local_6d8._0_8_) >> 4;
  local_644 = 0;
  local_63c = 0;
  local_64c = (int)lVar9 + (int)lVar10 + 1;
  local_648 = (undefined4)((ulong)(lVar10 + lVar9) >> 1);
  local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  if (local_6f8._8_8_ == local_6f8._0_8_) {
    local_638._0_4_ = 0xffffffff;
  }
  else {
    uVar12 = 0;
    pcVar6 = (pointer)local_6f8._0_8_;
    pFVar7 = (Functions *)local_6f8._8_8_;
    do {
      local_638._0_4_ = (uint)uVar12;
      if (local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_718,
                   (iterator)
                   local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish,(uint *)local_638);
        pcVar6 = (pointer)local_6f8._0_8_;
        pFVar7 = (Functions *)local_6f8._8_8_;
      }
      else {
        *local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = (uint)uVar12;
        local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)pFVar7 - (long)pcVar6 >> 4));
    local_638._0_4_ = 0xffffffff;
    if (local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      *local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0xffffffff;
      local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
      goto LAB_00ba6dda;
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&local_718,
             (iterator)
             local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish,(uint *)local_638);
LAB_00ba6dda:
  if (local_6d8._8_8_ != local_6d8._0_8_) {
    uVar12 = 0;
    pcVar6 = (pointer)local_6d8._0_8_;
    pFVar7 = (Functions *)local_6d8._8_8_;
    do {
      uVar8 = (int)((ulong)(local_6f8._8_8_ - local_6f8._0_8_) >> 4) + (int)uVar12;
      local_638._0_4_ = uVar8;
      if (local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_718,
                   (iterator)
                   local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish,(uint *)local_638);
        pcVar6 = (pointer)local_6d8._0_8_;
        pFVar7 = (Functions *)local_6d8._8_8_;
      }
      else {
        *local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar8;
        local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)pFVar7 - (long)pcVar6 >> 4));
  }
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_bufferIndirect);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_bufferIndirect);
  glu::CallLogWrapper::glBufferData(this_00,0x8f3f,0x14,&local_64c,0x88e4);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_ebo);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->_ebo);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8893,
             (long)local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start,
             local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  glu::CallLogWrapper::glEnable(this_00,0x8d69);
  glu::CallLogWrapper::glDrawElementsIndirect(this_00,5,0x1405,(void *)0x0);
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)CONCAT44(extraout_var,iVar3);
  iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = iVar3 * *(int *)(CONCAT44(extraout_var_00,iVar4) + 4);
  iVar4 = iVar3 + 3;
  if (-1 < iVar3) {
    iVar4 = iVar3;
  }
  local_638 = (undefined1  [8])0x3e4ccccd3dcccccd;
  pp_Stack_630 = (_func_int **)0x3f8000003e99999a;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_668,(long)(iVar4 >> 2),(value_type *)local_638,(allocator_type *)&local_680);
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)CONCAT44(extraout_var_01,iVar3);
  iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  local_638 = (undefined1  [8])0x0;
  pp_Stack_630 = (_func_int **)0x0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_680,(long)((iVar3 * *(int *)(CONCAT44(extraout_var_02,iVar4) + 4)) / 2),
             (value_type *)local_638,(allocator_type *)&local_6b0);
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)CONCAT44(extraout_var_03,iVar3);
  iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = iVar3 * *(int *)(CONCAT44(extraout_var_04,iVar4) + 4);
  iVar4 = iVar3 + 3;
  if (-1 < iVar3) {
    iVar4 = iVar3;
  }
  local_638 = (undefined1  [8])0x0;
  pp_Stack_630 = (_func_int **)0x0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_6b0,(long)(iVar4 >> 2),(value_type *)local_638,(allocator_type *)&local_698);
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)CONCAT44(extraout_var_05,iVar3);
  iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  local_638 = (undefined1  [8])0x0;
  pp_Stack_630 = (_func_int **)0x0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_698,(long)((iVar3 * *(int *)(CONCAT44(extraout_var_06,iVar4) + 4)) / 2),
             (value_type *)local_638,&local_719);
  local_638 = (undefined1  [8])((ulong)local_638 & 0xffffffffffffff00);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_630);
  local_4b8 = 0;
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)CONCAT44(extraout_var_07,iVar3);
  iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = *(int *)(CONCAT44(extraout_var_08,iVar4) + 4);
  iVar5 = iVar4 + 3;
  if (-1 < iVar4) {
    iVar5 = iVar4;
  }
  DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
            (&this->super_DrawIndirectBase,0,0,iVar3,iVar5 >> 2,
             local_6b0.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  uVar8 = *(uint *)CONCAT44(extraout_var_09,iVar3);
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)(CONCAT44(extraout_var_10,iVar3) + 4);
  iVar4 = iVar3 + 3;
  if (-1 < iVar3) {
    iVar4 = iVar3;
  }
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  uVar1 = *(uint *)CONCAT44(extraout_var_11,iVar3);
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)(CONCAT44(extraout_var_12,iVar3) + 4);
  iVar5 = iVar3 + 3;
  if (-1 < iVar3) {
    iVar5 = iVar3;
  }
  lVar9 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                    ((DrawIndirectBase *)
                     ((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                     m_renderCtx,&local_6b0,uVar8,iVar4 >> 2,&local_668,uVar1,iVar5 >> 2);
  DIResult::sub_result(&local_1b0,(DIResult *)local_638,lVar9);
  DILogger::~DILogger(&local_1b0);
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = *(int *)(CONCAT44(extraout_var_13,iVar3) + 4);
  iVar3 = iVar4 + 3;
  iVar4 = iVar4 + 6;
  if (-1 < iVar3) {
    iVar4 = iVar3;
  }
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)CONCAT44(extraout_var_14,iVar3);
  iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
            (&this->super_DrawIndirectBase,0,iVar4 >> 2,iVar3,
             *(int *)(CONCAT44(extraout_var_15,iVar5) + 4) / 2,
             local_698.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  uVar8 = *(uint *)CONCAT44(extraout_var_16,iVar3);
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)(CONCAT44(extraout_var_17,iVar3) + 4);
  iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  uVar1 = *(uint *)CONCAT44(extraout_var_18,iVar4);
  iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  lVar9 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                    ((DrawIndirectBase *)
                     ((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                     m_renderCtx,&local_698,uVar8,iVar3 / 2,&local_680,uVar1,
                     *(int *)(CONCAT44(extraout_var_19,iVar4) + 4) / 2);
  DIResult::sub_result(&local_330,(DIResult *)local_638,lVar9);
  DILogger::~DILogger(&local_330);
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)(CONCAT44(extraout_var_20,iVar3) + 4);
  iVar4 = iVar3 * 3 + 3;
  iVar3 = iVar3 * 3 + 6;
  if (-1 < iVar4) {
    iVar3 = iVar4;
  }
  iVar4 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar4 = *(int *)CONCAT44(extraout_var_21,iVar4);
  iVar5 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar5 = *(int *)(CONCAT44(extraout_var_22,iVar5) + 4);
  iVar11 = iVar5 + 3;
  if (-1 < iVar5) {
    iVar11 = iVar5;
  }
  DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
            (&this->super_DrawIndirectBase,0,iVar3 >> 2,iVar4,iVar11 >> 2,
             local_6b0.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  uVar8 = *(uint *)CONCAT44(extraout_var_23,iVar3);
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)(CONCAT44(extraout_var_24,iVar3) + 4);
  iVar4 = iVar3 + 3;
  if (-1 < iVar3) {
    iVar4 = iVar3;
  }
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  uVar1 = *(uint *)CONCAT44(extraout_var_25,iVar3);
  iVar3 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)(CONCAT44(extraout_var_26,iVar3) + 4);
  iVar5 = iVar3 + 3;
  if (-1 < iVar3) {
    iVar5 = iVar3;
  }
  lVar9 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                    ((DrawIndirectBase *)
                     ((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
                     m_renderCtx,&local_6b0,uVar8,iVar4 >> 2,&local_668,uVar1,iVar5 >> 2);
  DIResult::sub_result(&local_4b0,(DIResult *)local_638,lVar9);
  DILogger::~DILogger(&local_4b0);
  lVar9 = local_4b8;
  DILogger::~DILogger((DILogger *)local_638);
  if (local_698.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_698.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_698.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_698.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_6b0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6b0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_6b0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_6b0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_680.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_680.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_680.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_680.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_668.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_668.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_668.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_668.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_718.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_6d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_6d8._0_8_,local_6d8._16_8_ - local_6d8._0_8_);
  }
  if ((pointer)local_6f8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_6f8._0_8_,local_6f8._16_8_ - local_6f8._0_8_);
  }
  return lVar9;
}

Assistant:

virtual long Run()
	{
		_program = CreateProgram(shaders::vshSimple<api>(), "", shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		CColorArray coords1;
		TriangleStipGen(coords1, -1.0f, 1.0f, -1.0, -0.5, 2);

		CColorArray coords2;
		TriangleStipGen(coords2, -1.0f, 1.0f, 0.5, 1.0, 4);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_ARRAY_BUFFER, _buffer);

		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords1.size() + coords2.size()) * sizeof(coords1[0]), NULL,
					 GL_STREAM_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, (GLsizeiptr)(coords1.size() * sizeof(coords1[0])), &coords1[0]);
		glBufferSubData(GL_ARRAY_BUFFER, (GLintptr)(coords1.size() * sizeof(coords1[0])),
						(GLsizeiptr)(coords2.size() * sizeof(coords2[0])), &coords2[0]);
		glVertexAttribPointer(0, sizeof(coords1[0]) / sizeof(float), GL_FLOAT, GL_FALSE, sizeof(coords1[0]), 0);
		glEnableVertexAttribArray(0);

		DrawElementsIndirectCommand indirectElements = { 0, 0, 0, 0, 0 };
		indirectElements.count						 = static_cast<GLuint>(coords1.size() + coords2.size() + 1);
		indirectElements.primCount					 = static_cast<GLuint>((coords1.size() + coords2.size()) / 2);

		CElementArray elements;
		for (size_t i = 0; i < coords1.size(); ++i)
		{
			elements.push_back(static_cast<GLuint>(i));
		}

		elements.push_back(PrimitiveRestartIndex());
		for (size_t i = 0; i < coords2.size(); ++i)
		{
			elements.push_back(static_cast<GLuint>(coords1.size() + i));
		}

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawElementsIndirectCommand), &indirectElements, GL_STATIC_DRAW);

		glGenBuffers(1, &_ebo);
		glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
		glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
					 GL_STATIC_DRAW);

		EnablePrimitiveRestart();

		glDrawElementsIndirect(GL_TRIANGLE_STRIP, GL_UNSIGNED_INT, 0);

		CColorArray bufferRef1(getWindowWidth() * getWindowHeight() / 4, tcu::Vec4(0.1f, 0.2f, 0.3f, 1.0f));
		CColorArray bufferRef2(getWindowWidth() * getWindowHeight() / 2, tcu::Vec4(0.0f));
		CColorArray bufferTest1(getWindowWidth() * getWindowHeight() / 4, tcu::Vec4(0.0f));
		CColorArray bufferTest2(getWindowWidth() * getWindowHeight() / 2, tcu::Vec4(0.0f));

		DIResult result;
		ReadPixelsFloat<api>(0, 0, getWindowWidth(), getWindowHeight() / 4, &bufferTest1[0]);
		result.sub_result(BuffersCompare(bufferTest1, getWindowWidth(), getWindowHeight() / 4, bufferRef1,
										 getWindowWidth(), getWindowHeight() / 4));

		ReadPixelsFloat<api>(0, (getWindowHeight() + 3) / 4, getWindowWidth(), getWindowHeight() / 2, &bufferTest2[0]);
		result.sub_result(BuffersCompare(bufferTest2, getWindowWidth(), getWindowHeight() / 2, bufferRef2,
										 getWindowWidth(), getWindowHeight() / 2));

		ReadPixelsFloat<api>(0, (getWindowHeight() * 3 + 3) / 4, getWindowWidth(), getWindowHeight() / 4,
							 &bufferTest1[0]);
		result.sub_result(BuffersCompare(bufferTest1, getWindowWidth(), getWindowHeight() / 4, bufferRef1,
										 getWindowWidth(), getWindowHeight() / 4));

		return result.code();
	}